

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_bitset_container_andnot
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  _Bool _Var1;
  int iVar2;
  uint end_00;
  rle16_t rVar3;
  array_container_t *paVar4;
  bitset_container_t *bitset;
  uint32_t end;
  uint32_t start;
  rle16_t rle_1;
  int32_t rlepos_1;
  uint32_t last_pos;
  bitset_container_t *answer_1;
  int run_value;
  rle16_t rle;
  int32_t rlepos;
  array_container_t *answer;
  int card;
  container_t **dst_local;
  bitset_container_t *src_2_local;
  run_container_t *src_1_local;
  
  iVar2 = run_container_cardinality(src_1);
  if (iVar2 < 0x1001) {
    paVar4 = array_container_create_given_capacity(iVar2);
    paVar4->cardinality = 0;
    for (run_value = 0; run_value < src_1->n_runs; run_value = run_value + 1) {
      rVar3 = src_1->runs[run_value];
      for (answer_1._4_4_ = (uint)rVar3 & 0xffff;
          (int)answer_1._4_4_ <= (int)(((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10));
          answer_1._4_4_ = answer_1._4_4_ + 1) {
        _Var1 = bitset_container_get(src_2,(uint16_t)answer_1._4_4_);
        if (!_Var1) {
          iVar2 = paVar4->cardinality;
          paVar4->cardinality = iVar2 + 1;
          paVar4->array[iVar2] = (uint16_t)answer_1._4_4_;
        }
      }
    }
    *dst = paVar4;
    src_1_local._7_1_ = false;
  }
  else {
    bitset = bitset_container_clone(src_2);
    rle_1.value = 0;
    rle_1.length = 0;
    for (start = 0; (int)start < src_1->n_runs; start = start + 1) {
      end_00 = (uint)src_1->runs[(int)start] & 0xffff;
      rVar3 = (rle16_t)(end_00 + ((uint)src_1->runs[(int)start] >> 0x10) + 1);
      bitset_reset_range(bitset->words,(uint32_t)rle_1,end_00);
      bitset_flip_range(bitset->words,end_00,(uint32_t)rVar3);
      rle_1 = rVar3;
    }
    bitset_reset_range(bitset->words,(uint32_t)rle_1,0x10000);
    iVar2 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar2;
    if (bitset->cardinality < 0x1001) {
      paVar4 = array_container_from_bitset(bitset);
      *dst = paVar4;
      bitset_container_free(bitset);
      src_1_local._7_1_ = false;
    }
    else {
      *dst = bitset;
      src_1_local._7_1_ = true;
    }
  }
  return src_1_local._7_1_;
}

Assistant:

bool run_bitset_container_andnot(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    // follows the Java implementation as of June 2016
    int card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // must be an array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            for (int run_value = rle.value; run_value <= rle.value + rle.length;
                 ++run_value) {
                if (!bitset_container_get(src_2, (uint16_t)run_value)) {
                    answer->array[answer->cardinality++] = (uint16_t)run_value;
                }
            }
        }
        *dst = answer;
        return false;
    } else {  // we guess it will be a bitset, though have to check guess when
              // done
        bitset_container_t *answer = bitset_container_clone(src_2);

        uint32_t last_pos = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];

            uint32_t start = rle.value;
            uint32_t end = start + rle.length + 1;
            bitset_reset_range(answer->words, last_pos, start);
            bitset_flip_range(answer->words, start, end);
            last_pos = end;
        }
        bitset_reset_range(answer->words, last_pos, (uint32_t)(1 << 16));

        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality <= DEFAULT_MAX_SIZE) {
            *dst = array_container_from_bitset(answer);
            bitset_container_free(answer);
            return false;  // not bitset
        }
        *dst = answer;
        return true;  // bitset
    }
}